

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O1

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::matrix(RotationYY<std::complex<double>_> *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *__s;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<double>_> SVar3;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  uVar2 = *(ulong *)(in_RSI + 0x20);
  (this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x4;
  __s = (undefined8 *)operator_new__(0x100);
  memset(__s,0,0x100);
  *(undefined8 **)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable = __s;
  *__s = uVar1;
  __s[5] = 0;
  __s[6] = 0;
  __s[3] = 0;
  __s[4] = 0;
  __s[1] = 0;
  __s[2] = 0;
  __s[7] = uVar2;
  __s[8] = 0;
  __s[9] = 0;
  __s[10] = uVar1;
  __s[0xb] = 0;
  __s[0xc] = 0x8000000000000000;
  __s[0xd] = uVar2 ^ 0x8000000000000000;
  __s[0x10] = 0;
  __s[0x11] = 0;
  __s[0xe] = 0;
  __s[0xf] = 0;
  __s[0x12] = 0x8000000000000000;
  __s[0x13] = uVar2 ^ 0x8000000000000000;
  __s[0x14] = uVar1;
  __s[0x17] = 0;
  __s[0x18] = 0;
  __s[0x15] = 0;
  __s[0x16] = 0;
  __s[0x19] = uVar2;
  __s[0x1c] = 0;
  __s[0x1d] = 0;
  __s[0x1a] = 0;
  __s[0x1b] = 0;
  __s[0x1e] = uVar1;
  __s[0x1f] = 0;
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }